

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O3

ImageDataFunctionHeader * __thiscall
lrit::HeaderReader<lrit::ImageDataFunctionHeader>::getHeader
          (ImageDataFunctionHeader *__return_storage_ptr__,
          HeaderReader<lrit::ImageDataFunctionHeader> *this)

{
  ushort uVar1;
  int iVar2;
  undefined1 uVar3;
  uint16_t uVar4;
  
  iVar2 = this->p_;
  (this->h_).headerType =
       (this->b_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start[iVar2];
  uVar1 = *(ushort *)
           ((this->b_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start + (iVar2 + 1));
  (this->h_).headerLength = uVar1 << 8 | uVar1 >> 8;
  this->p_ = iVar2 + 3;
  uVar3 = (this->h_).field_0x1;
  uVar4 = (this->h_).headerLength;
  __return_storage_ptr__->headerType = (this->h_).headerType;
  __return_storage_ptr__->field_0x1 = uVar3;
  __return_storage_ptr__->headerLength = uVar4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&__return_storage_ptr__->data,&(this->h_).data);
  return __return_storage_ptr__;
}

Assistant:

H getHeader() {
    read(&h_.headerType);
    read(&h_.headerLength);
    return h_;
  }